

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

EntryPointInfo ** __thiscall
ThreadContext::RegisterEquivalentTypeCacheEntryPoint(ThreadContext *this,EntryPointInfo *entryPoint)

{
  RealCount *pRVar1;
  DListNodeBase<Js::EntryPointInfo_*> *pDVar2;
  DListNodeBase<Js::EntryPointInfo_*> *pDVar3;
  
  pDVar3 = (DListNodeBase<Js::EntryPointInfo_*> *)
           new<Memory::ArenaAllocator>(0x18,&this->equivalentTypeCacheInfoAllocator,0x366bee);
  pDVar3[1].next.base = (DListNodeBase<Js::EntryPointInfo_*> *)entryPoint;
  pDVar2 = (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.next.
           base;
  pDVar3->prev = pDVar2->prev;
  (pDVar3->next).base = pDVar2;
  *(DListNodeBase<Js::EntryPointInfo_*> **)pDVar2->prev = pDVar3;
  (pDVar2->prev).base = pDVar3;
  pRVar1 = &(this->equivalentTypeCacheEntryPoints).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return (EntryPointInfo **)(pDVar3 + 1);
}

Assistant:

Js::EntryPointInfo **
ThreadContext::RegisterEquivalentTypeCacheEntryPoint(Js::EntryPointInfo * entryPoint)
{
    return equivalentTypeCacheEntryPoints.PrependNode(&equivalentTypeCacheInfoAllocator, entryPoint);
}